

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.h
# Opt level: O1

bool __thiscall cmListFileArgument::operator==(cmListFileArgument *this,cmListFileArgument *r)

{
  size_t __n;
  int iVar1;
  bool bVar2;
  
  __n = (this->Value)._M_string_length;
  if (__n == (r->Value)._M_string_length) {
    if (__n == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp((this->Value)._M_dataplus._M_p,(r->Value)._M_dataplus._M_p,__n);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  return (bool)(this->Delim == r->Delim & bVar2);
}

Assistant:

bool operator==(const cmListFileArgument& r) const
  {
    return (this->Value == r.Value) && (this->Delim == r.Delim);
  }